

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O1

string * __thiscall
slang::ast::flagsToStr_abi_cxx11_
          (string *__return_storage_ptr__,ast *this,bitmask<slang::ast::MethodFlags> flags)

{
  uint uVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (((ulong)this & 1) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"virtual,");
  }
  if (((ulong)this & 2) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"pure,");
  }
  if (((ulong)this & 4) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"static,");
  }
  if (((ulong)this & 8) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"ctor,");
  }
  if (((ulong)this & 0x10) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"ifaceExtern,");
  }
  if (((ulong)this & 0x20) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"modportImport,");
  }
  if (((ulong)this & 0x40) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"modportExport,");
  }
  if ((char)((ulong)this & 0xffffffff) < '\0') {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"dpi,");
  }
  uVar1 = (uint)this;
  if ((uVar1 >> 8 & 1) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"context,");
  }
  if ((uVar1 >> 0xb & 1) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"forkJoin,");
  }
  if ((uVar1 >> 0xc & 1) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"defaultedSuperArg,");
  }
  if ((uVar1 >> 0xd & 1) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"initial,");
  }
  if ((uVar1 >> 0xe & 1) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"extends,");
  }
  if ((short)((ulong)this & 0xffffffff) < 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"final,");
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string flagsToStr(bitmask<MethodFlags> flags) {
    std::string str;
    if (flags.has(MethodFlags::Virtual))
        str += "virtual,";
    if (flags.has(MethodFlags::Pure))
        str += "pure,";
    if (flags.has(MethodFlags::Static))
        str += "static,";
    if (flags.has(MethodFlags::Constructor))
        str += "ctor,";
    if (flags.has(MethodFlags::InterfaceExtern))
        str += "ifaceExtern,";
    if (flags.has(MethodFlags::ModportImport))
        str += "modportImport,";
    if (flags.has(MethodFlags::ModportExport))
        str += "modportExport,";
    if (flags.has(MethodFlags::DPIImport))
        str += "dpi,";
    if (flags.has(MethodFlags::DPIContext))
        str += "context,";
    if (flags.has(MethodFlags::ForkJoin))
        str += "forkJoin,";
    if (flags.has(MethodFlags::DefaultedSuperArg))
        str += "defaultedSuperArg,";
    if (flags.has(MethodFlags::Initial))
        str += "initial,";
    if (flags.has(MethodFlags::Extends))
        str += "extends,";
    if (flags.has(MethodFlags::Final))
        str += "final,";
    if (!str.empty())
        str.pop_back();
    return str;
}